

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Parser.cpp
# Opt level: O0

bool __thiscall Parser::checkExpFuncDefinition(Parser *this)

{
  pointer *this_00;
  bool bVar1;
  bool bVar2;
  Token *this_01;
  Identifier *pIVar3;
  Token *pTVar4;
  Tokenizer *pTVar5;
  TokenizerPosition start_00;
  ExpressionFunctionHandler *pEVar6;
  optional<ExpressionFunctionHandle> oVar7;
  _Storage<ExpressionFunctionHandle,_true> local_c8;
  undefined1 local_c0;
  pointer local_b8;
  iterator local_b0;
  undefined1 local_a8 [8];
  vector<Token,_std::allocator<Token>_> functionContent;
  TokenizerPosition end;
  TokenizerPosition start;
  undefined1 local_70 [8];
  vector<Identifier,_std::allocator<Identifier>_> functionParameters;
  Identifier functionName;
  Identifier *identifier;
  Token *first;
  Parser *this_local;
  
  this_01 = peekToken(this,0);
  if (this_01->type == Identifier) {
    pIVar3 = Token::identifierValue(this_01);
    bVar1 = Identifier::startsWith(pIVar3,'.');
    if (bVar1) {
      pIVar3 = Token::identifierValue(this_01);
      std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view
                ((basic_string_view<char,_std::char_traits<char>_> *)
                 ((long)&functionName._name.field_2 + 8),".expfunc");
      bVar1 = Identifier::operator!=(pIVar3,stack0xffffffffffffffc8);
      if (!bVar1) {
        eatToken(this);
        this_00 = &functionParameters.super__Vector_base<Identifier,_std::allocator<Identifier>_>.
                   _M_impl.super__Vector_impl_data._M_end_of_storage;
        Identifier::Identifier((Identifier *)this_00);
        std::vector<Identifier,_std::allocator<Identifier>_>::vector
                  ((vector<Identifier,_std::allocator<Identifier>_> *)local_70);
        bVar1 = parseFunctionDeclaration
                          (this,(Identifier *)this_00,
                           (vector<Identifier,_std::allocator<Identifier>_> *)local_70);
        if (bVar1) {
          pTVar4 = nextToken(this);
          if (pTVar4->type == Comma) {
            pTVar5 = getTokenizer(this);
            start_00 = Tokenizer::getPosition(pTVar5);
            while( true ) {
              bVar2 = atEnd(this);
              bVar1 = false;
              if (!bVar2) {
                pTVar4 = peekToken(this,0);
                bVar1 = pTVar4->type != Separator;
              }
              if (!bVar1) break;
              eatToken(this);
            }
            pTVar5 = getTokenizer(this);
            functionContent.super__Vector_base<Token,_std::allocator<Token>_>._M_impl.
            super__Vector_impl_data._M_end_of_storage = (pointer)Tokenizer::getPosition(pTVar5);
            pTVar5 = getTokenizer(this);
            local_b8 = functionContent.super__Vector_base<Token,_std::allocator<Token>_>._M_impl.
                       super__Vector_impl_data._M_end_of_storage;
            local_b0 = start_00.it._M_node;
            Tokenizer::getTokens
                      ((vector<Token,_std::allocator<Token>_> *)local_a8,pTVar5,start_00,
                       (TokenizerPosition)
                       functionContent.super__Vector_base<Token,_std::allocator<Token>_>._M_impl.
                       super__Vector_impl_data._M_end_of_storage);
            bVar1 = isInsideUnknownBlock(this);
            if (bVar1) {
              printError<>(this,this_01,
                           "Expression function definition not allowed inside of block with non-trivial condition"
                          );
              this_local._7_1_ = false;
            }
            else {
              bVar1 = isInsideTrueBlock(this);
              if (bVar1) {
                pTVar4 = nextToken(this);
                if (pTVar4->type == Separator) {
                  pEVar6 = ExpressionFunctionHandler::instance();
                  oVar7 = ExpressionFunctionHandler::find
                                    (pEVar6,(Identifier *)
                                            &functionParameters.
                                             super__Vector_base<Identifier,_std::allocator<Identifier>_>
                                             ._M_impl.super__Vector_impl_data._M_end_of_storage);
                  local_c8 = oVar7.super__Optional_base<ExpressionFunctionHandle,_true,_true>.
                             _M_payload.super__Optional_payload_base<ExpressionFunctionHandle>.
                             _M_payload;
                  local_c0 = oVar7.super__Optional_base<ExpressionFunctionHandle,_true,_true>.
                             _M_payload.super__Optional_payload_base<ExpressionFunctionHandle>.
                             _M_engaged;
                  bVar1 = std::optional::operator_cast_to_bool((optional *)&local_c8._M_value);
                  if (bVar1) {
                    printError<Identifier>
                              (this,this_01,"Expression function \"%s\" already declared",
                               (Identifier *)
                               &functionParameters.
                                super__Vector_base<Identifier,_std::allocator<Identifier>_>._M_impl.
                                super__Vector_impl_data._M_end_of_storage);
                    this_local._7_1_ = false;
                  }
                  else {
                    pEVar6 = ExpressionFunctionHandler::instance();
                    ExpressionFunctionHandler::addUserFunction
                              (pEVar6,(Identifier *)
                                      &functionParameters.
                                       super__Vector_base<Identifier,_std::allocator<Identifier>_>.
                                       _M_impl.super__Vector_impl_data._M_end_of_storage,
                               (vector<Identifier,_std::allocator<Identifier>_> *)local_70,
                               (vector<Token,_std::allocator<Token>_> *)local_a8);
                    this_local._7_1_ = true;
                  }
                }
                else {
                  printError<>(this,this_01,".expfunc directive not terminated");
                  this_local._7_1_ = false;
                }
              }
              else {
                this_local._7_1_ = true;
              }
            }
            std::vector<Token,_std::allocator<Token>_>::~vector
                      ((vector<Token,_std::allocator<Token>_> *)local_a8);
          }
          else {
            printError<>(this,this_01,"Invalid expression function declaration");
            this_local._7_1_ = false;
          }
        }
        else {
          printError<>(this,this_01,"Invalid expression function declaration");
          this_local._7_1_ = false;
        }
        std::vector<Identifier,_std::allocator<Identifier>_>::~vector
                  ((vector<Identifier,_std::allocator<Identifier>_> *)local_70);
        Identifier::~Identifier
                  ((Identifier *)
                   &functionParameters.super__Vector_base<Identifier,_std::allocator<Identifier>_>.
                    _M_impl.super__Vector_impl_data._M_end_of_storage);
        return this_local._7_1_;
      }
    }
  }
  return false;
}

Assistant:

bool Parser::checkExpFuncDefinition()
{
	const Token& first = peekToken();
	if (first.type != TokenType::Identifier)
		return false;

	const auto &identifier = first.identifierValue();
	if (!identifier.startsWith('.') || first.identifierValue() != ".expfunc")
		return false;

	eatToken();

	Identifier functionName;
	std::vector<Identifier> functionParameters;

	// load declarationn
	if (!parseFunctionDeclaration(functionName, functionParameters))
	{
		printError(first, "Invalid expression function declaration");
		return false;
	}

	if (nextToken().type != TokenType::Comma)
	{
		printError(first, "Invalid expression function declaration");
		return false;
	}

	// load definition
	TokenizerPosition start = getTokenizer()->getPosition();

	while (!atEnd() && peekToken().type != TokenType::Separator)
		eatToken();

	TokenizerPosition end = getTokenizer()->getPosition();
	auto functionContent = getTokenizer()->getTokens(start,end);

	// checks

	// Expression functions have to be defined at parse time, so they can't be defined in blocks
	// with non-trivial conditions
	if (isInsideUnknownBlock())
	{
		printError(first, "Expression function definition not allowed inside of block with non-trivial condition");
		return false;
	}

	// if we are in a known false block, don't define the function
	if (!isInsideTrueBlock())
		return true;

	if(nextToken().type != TokenType::Separator)
	{
		printError(first, ".expfunc directive not terminated");
		return false;
	}

	// duplicate check
	if (ExpressionFunctionHandler::instance().find(functionName))
	{
		printError(first, "Expression function \"%s\" already declared", functionName);
		return false;
	}

	// register function
	ExpressionFunctionHandler::instance().addUserFunction(functionName, functionParameters, functionContent);
	return true;
}